

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::bitcast_from_builtin_load
          (CompilerGLSL *this,uint32_t source_id,string *expr,SPIRType *expr_type)

{
  bool bVar1;
  undefined1 local_60 [36];
  ID local_3c;
  BaseType expected_type;
  ID local_34;
  BuiltIn builtin;
  SPIRVariable *var;
  SPIRType *expr_type_local;
  string *expr_local;
  CompilerGLSL *pCStack_10;
  uint32_t source_id_local;
  CompilerGLSL *this_local;
  
  var = (SPIRVariable *)expr_type;
  expr_type_local = (SPIRType *)expr;
  expr_local._4_4_ = source_id;
  pCStack_10 = this;
  _builtin = Compiler::maybe_get_backing_variable(&this->super_Compiler,source_id);
  if (_builtin != (SPIRVariable *)0x0) {
    expr_local._4_4_ =
         TypedID::operator_cast_to_unsigned_int((TypedID *)&(_builtin->super_IVariant).self);
  }
  TypedID<(spirv_cross::Types)0>::TypedID(&local_34,expr_local._4_4_);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,local_34,DecorationBuiltIn);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    return;
  }
  TypedID<(spirv_cross::Types)0>::TypedID(&local_3c,expr_local._4_4_);
  expected_type = Compiler::get_decoration(&this->super_Compiler,local_3c,DecorationBuiltIn);
  local_60._32_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
  if (((expected_type - Short < 3) || (expected_type - Int64 < 2)) || (expected_type == Sampler)) {
LAB_0032a739:
    local_60._32_4_ = 7;
  }
  else {
    if (5 < expected_type - (Image|UInt)) {
      if (((expected_type - 0x2a < 2) || (expected_type - 0x1148 < 3)) || (expected_type == 0x1396))
      goto LAB_0032a739;
      if (1 < expected_type - 0x14c7) {
        if (expected_type == 0x14cf) goto LAB_0032a739;
        if (expected_type != 0x14e7) goto LAB_0032a74d;
      }
    }
    local_60._32_4_ = 8;
  }
LAB_0032a74d:
  if (local_60._32_4_ != *(uint *)&(var->super_IVariant).field_0xc) {
    bitcast_expression((CompilerGLSL *)local_60,(SPIRType *)this,(BaseType)var,
                       (string *)(ulong)(uint)local_60._32_4_);
    ::std::__cxx11::string::operator=((string *)expr_type_local,(string *)local_60);
    ::std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

void CompilerGLSL::bitcast_from_builtin_load(uint32_t source_id, std::string &expr, const SPIRType &expr_type)
{
	auto *var = maybe_get_backing_variable(source_id);
	if (var)
		source_id = var->self;

	// Only interested in standalone builtin variables.
	if (!has_decoration(source_id, DecorationBuiltIn))
		return;

	auto builtin = static_cast<BuiltIn>(get_decoration(source_id, DecorationBuiltIn));
	auto expected_type = expr_type.basetype;

	// TODO: Fill in for more builtins.
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInPrimitiveId:
	case BuiltInViewportIndex:
	case BuiltInInstanceId:
	case BuiltInInstanceIndex:
	case BuiltInVertexId:
	case BuiltInVertexIndex:
	case BuiltInSampleId:
	case BuiltInBaseVertex:
	case BuiltInBaseInstance:
	case BuiltInDrawIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInInstanceCustomIndexNV:
		expected_type = SPIRType::Int;
		break;

	case BuiltInGlobalInvocationId:
	case BuiltInLocalInvocationId:
	case BuiltInWorkgroupId:
	case BuiltInLocalInvocationIndex:
	case BuiltInWorkgroupSize:
	case BuiltInNumWorkgroups:
	case BuiltInIncomingRayFlagsNV:
	case BuiltInLaunchIdNV:
	case BuiltInLaunchSizeNV:
		expected_type = SPIRType::UInt;
		break;

	default:
		break;
	}

	if (expected_type != expr_type.basetype)
		expr = bitcast_expression(expr_type, expected_type, expr);
}